

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNCodeBody::build_debug_table(CTPNCodeBody *this,ulong start_ofs,int include_lines)

{
  uint16_t tmp;
  undefined2 uVar1;
  tcgen_line_t *ptVar2;
  CTcPrsSymtab *pCVar3;
  CTcPrsSymtab *pCVar4;
  size_t sVar5;
  int iVar6;
  size_t n;
  int iVar7;
  uint16_t tmp_6;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  write_local_to_debug_frame_ctx cbctx;
  undefined8 local_4c;
  undefined2 local_42;
  ulong local_40;
  ulong local_38;
  
  local_38 = CONCAT44(local_38._4_4_,include_lines);
  pCVar3 = G_cs->frame_head_;
  local_40 = start_ofs;
  if (pCVar3 == (CTcPrsSymtab *)0x0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    do {
      local_4c = 1;
      CTcPrsSymtab::enum_entries(pCVar3,write_local_to_debug_frame,&local_4c);
      iVar8 = iVar7 + 1;
      iVar6 = iVar8;
      if (local_4c._4_4_ == 0) {
        iVar8 = 0;
        iVar6 = iVar7;
      }
      iVar7 = iVar6;
      pCVar3->list_index_ = iVar8;
      pCVar3 = pCVar3->list_next_;
    } while (pCVar3 != (CTcPrsSymtab *)0x0);
  }
  iVar8 = (int)local_38;
  if ((int)local_38 != 0 || iVar7 != 0) {
    local_4c = CONCAT62(local_4c._2_6_,
                        (short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)local_40);
    sVar5 = 2;
    CTcDataStream::write_at(&G_cs->super_CTcDataStream,local_40 + 8,(char *)&local_4c,2);
    if (0 < G_sizes.dbg_hdr) {
      iVar6 = G_sizes.dbg_hdr + 1;
      do {
        local_4c = local_4c & 0xffffffffffffff00;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x1,sVar5);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
    CTcGenTarg::add_debug_line_table(G_cg,(G_cs->super_CTcDataStream).ofs_);
    if (iVar8 == 0) {
      local_4c = (ulong)local_4c._2_6_ << 0x10;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x2,sVar5);
    }
    else {
      local_4c = CONCAT62(local_4c._2_6_,(short)G_cs->line_cnt_);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x2,sVar5);
      if (G_cs->line_cnt_ != 0) {
        n = 0;
        do {
          ptVar2 = CTcCodeStream::get_line_rec(G_cs,n);
          iVar8 = (int)&local_4c;
          local_4c._0_2_ = (short)ptVar2->ofs;
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x2,sVar5);
          local_4c = CONCAT62(local_4c._2_6_,(short)ptVar2->source_id);
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x2,sVar5);
          local_4c = CONCAT44(local_4c._4_4_,(int)ptVar2->source_line);
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x4,sVar5);
          pCVar3 = ptVar2->frame;
          while( true ) {
            bVar11 = pCVar3 == (CTcPrsSymtab *)0x0;
            sVar5 = CONCAT71((int7)(sVar5 >> 8),bVar11);
            if ((bVar11) || (pCVar3->list_index_ != 0)) break;
            pCVar3 = pCVar3->parent_;
          }
          if (bVar11) {
            uVar1 = 0;
          }
          else {
            uVar1 = (undefined2)pCVar3->list_index_;
          }
          local_4c = CONCAT62(local_4c._2_6_,uVar1);
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x2,sVar5);
          if (10 < G_sizes.dbg_line) {
            iVar6 = G_sizes.dbg_line + -9;
            do {
              local_4c = local_4c & 0xffffffffffffff00;
              CTcDataStream::write(&G_cs->super_CTcDataStream,iVar8,(void *)0x1,sVar5);
              iVar6 = iVar6 + -1;
            } while (1 < iVar6);
          }
          n = n + 1;
        } while (n < G_cs->line_cnt_);
      }
    }
    local_40 = (G_cs->super_CTcDataStream).ofs_;
    local_4c = local_4c & 0xffffffffffff0000;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x2,sVar5);
    local_4c = CONCAT62(local_4c._2_6_,(short)iVar7);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x2,sVar5);
    uVar9 = (G_cs->super_CTcDataStream).ofs_;
    if (iVar7 != 0) {
      lVar10 = (long)iVar7;
      do {
        local_4c = local_4c & 0xffffffffffff0000;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x2,sVar5);
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pCVar3 = G_cs->frame_head_;
    if (pCVar3 != (CTcPrsSymtab *)0x0) {
      do {
        if (pCVar3->list_index_ != 0) {
          sVar5 = 2;
          local_4c._0_2_ = (short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)uVar9;
          CTcDataStream::write_at(&G_cs->super_CTcDataStream,uVar9,(char *)&local_4c,2);
          local_38 = uVar9 + 2;
          pCVar4 = pCVar3;
          do {
            pCVar4 = pCVar4->parent_;
            if (pCVar4 == (CTcPrsSymtab *)0x0) break;
          } while (pCVar4->list_index_ == 0);
          if (pCVar4 == (CTcPrsSymtab *)0x0) {
            local_4c._0_2_ = 0;
          }
          else {
            local_4c._0_2_ = (short)pCVar4->list_index_;
          }
          iVar7 = (int)&local_4c;
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar7,(void *)0x2,sVar5);
          uVar9 = (G_cs->super_CTcDataStream).ofs_;
          local_4c = (ulong)local_4c._2_6_ << 0x10;
          CTcDataStream::write(&G_cs->super_CTcDataStream,iVar7,(void *)0x2,sVar5);
          if (7 < G_sizes.dbg_frame) {
            local_4c._0_2_ = (short)pCVar3->start_ofs_;
            CTcDataStream::write(&G_cs->super_CTcDataStream,iVar7,(void *)0x2,sVar5);
            local_4c = CONCAT62(local_4c._2_6_,(short)pCVar3->end_ofs_);
            CTcDataStream::write(&G_cs->super_CTcDataStream,iVar7,(void *)0x2,sVar5);
          }
          if (8 < G_sizes.dbg_frame) {
            iVar8 = G_sizes.dbg_frame + -7;
            do {
              local_4c = local_4c & 0xffffffffffffff00;
              CTcDataStream::write(&G_cs->super_CTcDataStream,iVar7,(void *)0x1,sVar5);
              iVar8 = iVar8 + -1;
            } while (1 < iVar8);
          }
          local_4c = 0;
          CTcPrsSymtab::enum_entries(pCVar3,write_local_to_debug_frame,&local_4c);
          local_42 = local_4c._4_2_;
          CTcDataStream::write_at(&G_cs->super_CTcDataStream,uVar9,(char *)&local_42,2);
          uVar9 = local_38;
        }
        pCVar3 = pCVar3->list_next_;
      } while (pCVar3 != (CTcPrsSymtab *)0x0);
    }
    local_4c = CONCAT62(local_4c._2_6_,
                        (short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)local_40);
    sVar5 = 2;
    CTcDataStream::write_at(&G_cs->super_CTcDataStream,local_40,(char *)&local_4c,2);
    local_4c = local_4c & 0xffffffff00000000;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_4c,(void *)0x4,sVar5);
  }
  return;
}

Assistant:

void CTPNCodeBody::build_debug_table(ulong start_ofs, int include_lines)
{
    size_t i;

    /*
     *   Count up the frames that contain local variables.  Frames that
     *   contain no locals can be elided to reduce the size of the file,
     *   since they carry no information.  
     */
    CTcPrsSymtab *frame;
    int frame_cnt;
    for (frame_cnt = 0, frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* enumerate the entries through our counting callback */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = TRUE;
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* check to see if it has any locals */
        if (cbctx.count != 0)
        {
            /* it has locals - renumber it to the current list position */
            ++frame_cnt;
            frame->set_list_index(frame_cnt);
        }
        else
        {
            /* no locals - flag it as empty by setting its list index to 0 */
            frame->set_list_index(0);
        }
    }

    /*
     *   If we're not writing line records, and we don't have any frames with
     *   local variables, skip writing the debug table.  The debug table in
     *   this case is for local variable reflection information only, so if
     *   we don't have any locals, we don't need the table at all.  
     */
    if (!include_lines && frame_cnt == 0)
        return;

    /* fix up the debug record offset in the prolog to point here */
    G_cs->write2_at(start_ofs + 8, G_cs->get_ofs() - start_ofs);

    /*
     *   Write the debug table header.  In the current VM version, this is
     *   empty, so we have nothing to write.  However, if we're dynamically
     *   targeting a newer version, pad out any expected header space with
     *   zeros.  
     */
    for (int j = G_sizes.dbg_hdr ; j > 0 ; --j)
        G_cs->write(0);

    /* 
     *   Add this offset to our list of line records.  If we're creating an
     *   object file, upon re-loading the object file, we'll need to go
     *   through all of the line record tables and fix up the file references
     *   to the final file numbering system at link time, so we need this
     *   memory of where the line record are.  We'll also need to fix up the
     *   local variable name records to point to the consolidated set of
     *   strings in the constant pool.  
     */
    G_cg->add_debug_line_table(G_cs->get_ofs());

    /* if desired, write the source code location ("line") records */
    if (include_lines)
    {
        /* write the number of line records */
        G_cs->write2(G_cs->get_line_rec_count());

        /* write the line records themselves */
        for (i = 0 ; i < G_cs->get_line_rec_count() ; ++i)
        {
            /* get this record */
            tcgen_line_t *rec = G_cs->get_line_rec(i);

            /* write the offset of the statement's first opcode */
            G_cs->write2(rec->ofs);

            /* write the source file ID and line number */
            G_cs->write2(rec->source_id);
            G_cs->write4(rec->source_line);

            /* 
             *   Get the frame for the line record.  If the frame is empty,
             *   use the parent frame instead, since we omit empty frames.
             */
            CTcPrsSymtab *fr = rec->frame;
            while (fr != 0 && fr->get_list_index() == 0)
                fr = fr->get_parent();

            /* write the frame ID */
            G_cs->write2(fr == 0 ? 0 : fr->get_list_index());

            /* add any padding expected in the target VM version */
            for (int j = G_sizes.dbg_line - 10 ; j > 0 ; --j)
                G_cs->write(0);
        }
    }
    else
    {
        /* no line records - write zero as the line count */
        G_cs->write2(0);
    }

    /* 
     *   write a placeholder pointer to the next byte after the end of the
     *   frame table 
     */
    ulong post_ptr_ofs = G_cs->get_ofs();
    G_cs->write2(0);

    /* write the frame count */
    G_cs->write2(frame_cnt);

    /* 
     *   Write a placeholder frame index table.  We will come back and fix up
     *   this table as we actually write out the frames, but we don't
     *   actually know how big the individual frame records will be yet, so
     *   we can only write placeholders for them for now.  First, note where
     *   the frame index table begins.  
     */
    ulong index_ofs = G_cs->get_ofs();

    /* write the placeholder index entries */
    for (i = 0 ; i < (size_t)frame_cnt ; ++i)
        G_cs->write2(0);

    /* write the individual frames */
    for (frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* 
         *   if this frame has a zero list index, it means that it contains
         *   no writable symbols, so we can omit it from the debug table 
         */
        if (frame->get_list_index() == 0)
            continue;

        /* 
         *   go back and fill in the correct offset (from the entry itself)
         *   in the index table entry for this frame 
         */
        G_cs->write2_at(index_ofs, G_cs->get_ofs() - index_ofs);

        /* move on to the next index entry */
        index_ofs += 2;

        /* 
         *   Get the effective parent.  If the actual parent doesn't have a
         *   list index, it's empty, so we're not writing it.  Find the
         *   nearest parent of the parent that we'll actually write, and use
         *   that as our effective parent. 
         */
        CTcPrsSymtab *par;
        for (par = frame->get_parent() ;
             par != 0 && par->get_list_index() == 0 ;
             par = par->get_parent()) ;

        /* write the ID of the enclosing frame */
        G_cs->write2(par != 0 ? par->get_list_index() : 0);

        /* 
         *   write a placeholder for the count of the number of entries in
         *   the frame, and remember where the placeholder is so we can come
         *   back and fix it up later 
         */
        ulong count_ofs = G_cs->get_ofs();
        G_cs->write2(0);

        /* add the bytecode range covered, if there's room in the format */
        if (G_sizes.dbg_frame >= 8)
        {
            G_cs->write2(frame->get_start_ofs());
            G_cs->write2(frame->get_end_ofs());
        }

        /* pad out any extra space */
        for (int j = G_sizes.dbg_frame - 8 ; j > 0 ; --j)
            G_cs->write(0);

        /* initialize the enumeration callback context */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = FALSE;

        /* write this frame table's entries */
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* go back and fix up the symbol count */
        G_cs->write2_at(count_ofs, cbctx.count);
    }

    /* 
     *   go back and fill in the post-pointer offset - this is a pointer to
     *   the next byte after the end of the frame table; write the offset
     *   from the post-pointer field to the current location 
     */
    G_cs->write2_at(post_ptr_ofs, G_cs->get_ofs() - post_ptr_ofs);

    /* 
     *   write the required UINT4 zero value after the frame table - this
     *   is a placeholder for future expansion (if we add more information
     *   to the debug table later, this value will be non-zero to indicate
     *   the presence of the additional information) 
     */
    G_cs->write4(0);
}